

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byteorder.c
# Opt level: O1

ExprInfo expr_info(List *expr,ByteOrder hint,ExprInfo *field_info)

{
  int iVar1;
  byte bVar2;
  byte bVar3;
  TokenType TVar4;
  char *pcVar5;
  BOOL BVar6;
  ulong uVar7;
  ListStruct *pLVar8;
  char *fmt;
  ByteSize BVar9;
  ulong uVar10;
  ulong uVar11;
  ExprInfo EVar12;
  char buf [256];
  int local_13c;
  char local_138 [264];
  
  if (expr == (List *)0x0) {
    BVar6 = FALSE;
    uVar7 = 0;
    goto LAB_0010f045;
  }
  TVar4 = (expr->token).type;
  uVar7 = 2;
  uVar10 = 8;
  BVar6 = TRUE;
  switch(TVar4) {
  case TOK_FALSE:
  case TOK_TRUE:
  case TOK_CCC:
  case TOK_CCN:
  case TOK_CCV:
  case TOK_CCX:
  case TOK_CCNZ:
switchD_0010ed8c_caseD_3a:
    BVar6 = FALSE;
    uVar10 = 0;
    break;
  case TOK_IF:
  case TOK_SWITCH:
  case TOK_AND:
  case TOK_OR:
  case TOK_XOR:
  case TOK_NOT:
  case TOK_EQUAL:
  case TOK_NOT_EQUAL:
  case TOK_GREATER_THAN:
  case TOK_LESS_THAN:
  case TOK_GREATER_OR_EQUAL:
  case TOK_LESS_OR_EQUAL:
  case TOK_AMODE_PTR:
  case TOK_REVERSED_AMODE_PTR:
  case TOK_IDENTIFIER:
  case TOK_LEFT_PAREN:
  case TOK_RIGHT_PAREN:
  case TOK_NOP:
  case TOK_UNION:
  case TOK_INTERSECT:
switchD_0010ed2c_caseD_2:
    pcVar5 = unparse_token(&expr->token,local_138);
    fmt = "byteorder.c: Don\'t know how to process endianness/byte size for %s.\n";
LAB_0010edaa:
    parse_error(expr,fmt,pcVar5);
switchD_0010ed8c_caseD_2:
    BVar6 = FALSE;
    uVar10 = 0;
    uVar7 = 0;
    break;
  case TOK_DEFAULT:
    uVar10 = 4;
LAB_0010ee45:
    BVar6 = FALSE;
    break;
  case TOK_DOLLAR_DATA_REGISTER:
  case TOK_DOLLAR_ADDRESS_REGISTER:
  case TOK_DOLLAR_GENERAL_REGISTER:
  case TOK_DATA_REGISTER:
  case TOK_ADDRESS_REGISTER:
  case TOK_TEMP_REGISTER:
switchD_0010ed2c_caseD_f:
    uVar10 = (ulong)(expr->token).u.reginfo.size;
    BVar6 = (BOOL)(expr->token).u.reginfo.sgnd;
    break;
  case TOK_DOLLAR_AMODE:
  case TOK_DOLLAR_REVERSED_AMODE:
  case TOK_AMODE:
  case TOK_REVERSED_AMODE:
    uVar10 = (ulong)(expr->token).u.reginfo.size;
    BVar6 = (BOOL)(expr->token).u.reginfo.sgnd;
    uVar7 = 3;
    break;
  case TOK_DOLLAR_NUMBER:
    bVar2 = (expr->token).u.reginfo.which;
    uVar7 = (ulong)field_info[bVar2].order;
    bVar3 = (expr->token).u.reginfo.size;
    uVar10 = (ulong)bVar3;
    BVar6 = (BOOL)(expr->token).u.reginfo.sgnd;
    if (field_info[bVar2].size != (uint)bVar3 && field_info[bVar2].size != BS_UNKNOWN) {
      pcVar5 = unparse_token(&expr->token,local_138);
      parse_error(expr,"Operand field %s defined with more than one different size! (%d/%d)\n",
                  pcVar5,(ulong)field_info[(expr->token).u.reginfo.which].size,
                  (ulong)(expr->token).u.reginfo.size);
    }
    break;
  case TOK_DOLLAR_AMODE_PTR:
  case TOK_DOLLAR_REVERSED_AMODE_PTR:
    break;
  case TOK_QUOTED_STRING:
switchD_0010ed2c_caseD_1c:
    uVar10 = 4;
    goto LAB_0010ee34;
  case TOK_NUMBER:
    uVar10 = 0;
LAB_0010ee34:
    BVar6 = TRUE;
    break;
  default:
    if (TVar4 == TOK_CODE) goto LAB_0010ee45;
    if (TVar4 != TOK_LIST) goto switchD_0010ed2c_caseD_2;
    expr = expr->car;
    TVar4 = (expr->token).type;
    if (0x4a < TVar4 - TOK_IF) {
switchD_0010ed8c_caseD_f:
      pcVar5 = unparse_token(&expr->token,local_138);
      fmt = "byteorder.c: Don\'t know how to process endianness/byte size for operator %s.\n";
      goto LAB_0010edaa;
    }
    BVar6 = FALSE;
    switch(TVar4) {
    case TOK_IF:
    case TOK_SWITCH:
    case TOK_EXPLICIT_LIST:
    case TOK_LIST:
      goto switchD_0010ed8c_caseD_2;
    case TOK_DEFAULT:
      uVar10 = 4;
      break;
    case TOK_AND:
    case TOK_OR:
    case TOK_XOR:
    case TOK_NOT:
    case TOK_EQUAL:
    case TOK_NOT_EQUAL:
    case TOK_GREATER_THAN:
    case TOK_LESS_THAN:
    case TOK_GREATER_OR_EQUAL:
    case TOK_LESS_OR_EQUAL:
      uVar10 = 1;
      break;
    default:
      goto switchD_0010ed8c_caseD_f;
    case TOK_SHIFT_LEFT:
    case TOK_SHIFT_RIGHT:
      EVar12 = expr_info(expr->cdr,hint,field_info);
      goto LAB_0010f027;
    case TOK_ASSIGN:
      pLVar8 = expr->cdr;
      if ((pLVar8->token).type - TOK_CCC < 5) {
        pLVar8 = pLVar8->cdr;
      }
      EVar12 = expr_info(pLVar8,hint,field_info);
      uVar7 = EVar12._0_8_;
LAB_0010f027:
      BVar6 = EVar12.sgnd;
      uVar10 = EVar12._0_8_ >> 0x20;
      break;
    case TOK_PLUS:
    case TOK_MINUS:
    case TOK_MULTIPLY:
    case TOK_DIVIDE:
    case TOK_MOD:
      pLVar8 = expr->cdr;
      if (pLVar8 == (ListStruct *)0x0) {
        uVar10 = 0;
      }
      else {
        BVar9 = BS_UNKNOWN;
        do {
          EVar12 = expr_info(pLVar8,hint,field_info);
          uVar10 = EVar12._0_8_ >> 0x20;
          if (EVar12.size < BVar9) {
            uVar10 = (ulong)BVar9;
          }
          pLVar8 = pLVar8->cdr;
          BVar9 = (ByteSize)uVar10;
        } while (pLVar8 != (ListStruct *)0x0);
      }
      do {
        expr = expr->cdr;
        if (expr == (List *)0x0) break;
        EVar12 = expr_info(expr,hint,field_info);
      } while (EVar12.sgnd != FALSE);
      BVar6 = (BOOL)(expr == (List *)0x0);
      break;
    case TOK_BITWISE_AND:
    case TOK_BITWISE_OR:
    case TOK_BITWISE_XOR:
    case TOK_BITWISE_NOT:
      pLVar8 = expr->cdr;
      uVar10 = 0;
      if (pLVar8 == (ListStruct *)0x0) {
        BVar6 = TRUE;
        local_13c = 0;
        iVar1 = 0;
      }
      else {
        iVar1 = 0;
        BVar6 = TRUE;
        local_13c = 0;
        do {
          if ((pLVar8->token).type != TOK_NUMBER) {
            EVar12 = expr_info(pLVar8,hint,field_info);
            if (EVar12.order == BO_NATIVE) {
              local_13c = local_13c + 1;
            }
            else if (EVar12.order == BO_BIG_ENDIAN) {
              iVar1 = iVar1 + 1;
            }
            if (EVar12.sgnd == FALSE) {
              BVar6 = FALSE;
            }
          }
          pLVar8 = pLVar8->cdr;
        } while (pLVar8 != (ListStruct *)0x0);
      }
      uVar7 = (ulong)(local_13c < iVar1 | 2);
      if (iVar1 == local_13c) {
        uVar7 = (ulong)hint;
      }
      pLVar8 = expr->cdr;
      if (pLVar8 != (ListStruct *)0x0) {
        uVar11 = 0;
        do {
          EVar12 = expr_info(pLVar8,hint,field_info);
          uVar10 = EVar12._0_8_ >> 0x20;
          if (EVar12.size < (ByteSize)uVar11) {
            uVar10 = uVar11;
          }
          pLVar8 = pLVar8->cdr;
          uVar11 = uVar10;
        } while (pLVar8 != (ListStruct *)0x0);
      }
      break;
    case TOK_FUNC_CALL:
      goto switchD_0010ed2c_caseD_1c;
    case TOK_CAST:
      goto switchD_0010ed8c_caseD_3a;
    case TOK_DEREF:
      bVar2 = (expr->token).u.reginfo.size;
      uVar10 = 0;
      if (bVar2 != 0) {
        BVar6 = (BOOL)(expr->token).u.reginfo.sgnd;
        uVar7 = 3;
        uVar10 = (ulong)bVar2;
      }
      break;
    case TOK_SWAP:
      EVar12 = expr_info(expr->cdr,hint,field_info);
      uVar7 = EVar12._0_8_;
      if (EVar12.order == BO_BIG_ENDIAN) {
        uVar7 = 2;
      }
      else if (EVar12.order == BO_NATIVE) {
        uVar7 = 3;
      }
      goto switchD_0010ed2c_caseD_f;
    }
  }
  uVar7 = uVar7 & 0xffffffff | uVar10 << 0x20;
LAB_0010f045:
  EVar12.sgnd = BVar6;
  EVar12.order = (int)uVar7;
  EVar12.size = (int)(uVar7 >> 0x20);
  return EVar12;
}

Assistant:

static ExprInfo
expr_info (const List *expr, ByteOrder hint, ExprInfo *field_info)
{
  ExprInfo info = { BO_UNKNOWN, BS_UNKNOWN, FALSE };   /* Defaults. */
  const Token *t;
  char buf[256];

  if (expr == NULL)
    return info;

  t = &expr->token;
  switch (t->type) {
  case TOK_DATA_REGISTER:
  case TOK_ADDRESS_REGISTER:
  case TOK_TEMP_REGISTER:
    info.order = BO_NATIVE;
    info.size  = t->u.reginfo.size;
    info.sgnd  = t->u.reginfo.sgnd;
    break;

  case TOK_DOLLAR_DATA_REGISTER:
  case TOK_DOLLAR_ADDRESS_REGISTER:
  case TOK_DOLLAR_GENERAL_REGISTER:
    info.order = BO_NATIVE;
    info.size  = t->u.dollarinfo.size;
    info.sgnd  = t->u.dollarinfo.sgnd;
    break;

  case TOK_DOLLAR_AMODE:              /* We assume that by the time we reach */
  case TOK_DOLLAR_REVERSED_AMODE:     /*  here, all reg amodes have been     */
    info.order = BO_BIG_ENDIAN;       /*  converted to dollar_reg's.         */
    info.size  = t->u.dollarinfo.size;
    info.sgnd  = t->u.dollarinfo.sgnd;
    break;

  case TOK_DOLLAR_AMODE_PTR:
  case TOK_DOLLAR_REVERSED_AMODE_PTR:
    info.order = BO_NATIVE;
    info.size  = sizeof (void *);
    info.sgnd  = TRUE;
    break;

  case TOK_AMODE:                     /* We assume that by the time we reach */
  case TOK_REVERSED_AMODE:            /*  here, all reg amodes have been     */
    info.order = BO_BIG_ENDIAN;       /*  converted to dollar_reg's.         */
    info.size  = t->u.amodeinfo.size;
    info.sgnd  = t->u.amodeinfo.sgnd;
    break;

  case TOK_CODE:
    info.order = BO_NATIVE;
    info.size  = sizeof (void *);
    info.sgnd  = FALSE;
    break;

  case TOK_NUMBER:
    info.order = BO_NATIVE;
    info.size  = BS_UNKNOWN;
    info.sgnd  = TRUE;
    break;

  case TOK_DEFAULT:
    info.order = BO_NATIVE;   /* So it's a legal case number. */
    info.size  = BS_LONG;
    info.sgnd  = FALSE;
    break;

  case TOK_CCC:
  case TOK_CCN:
  case TOK_CCV:
  case TOK_CCX:
  case TOK_CCNZ:
    info.order = BO_NATIVE;
#ifdef CCR_ELEMENT_8_BITS
    info.size  = BS_BYTE;
#else
    info.size  = BS_UNKNOWN;
#endif
    info.sgnd  = FALSE;
    break;

  case TOK_DOLLAR_NUMBER:
    info.order = field_info[t->u.dollarinfo.which].order;
    info.size  = t->u.dollarinfo.size;
    info.sgnd  = t->u.dollarinfo.sgnd;
    if (field_info[t->u.dollarinfo.which].size != BS_UNKNOWN
	&& field_info[t->u.dollarinfo.which].size != info.size)
      parse_error (expr, "Operand field %s defined with more than one "
		   "different size! (%d/%d)\n",
		   unparse_token (t, buf),
		   field_info[t->u.dollarinfo.which].size,
		   t->u.dollarinfo.size);
    break;

  case TOK_FALSE:
  case TOK_TRUE:
    info.order = BO_NATIVE;
    info.size  = BS_UNKNOWN;
    info.sgnd  = NO;
    break;

  case TOK_QUOTED_STRING:
    info.order = BO_NATIVE;
    info.size  = BS_LONG;  /* Who knows what is appropriate here. */
    info.sgnd  = TRUE;     /* Sure, why not. */
    break;

  case TOK_LIST:
    expr = expr->car;
    t = &expr->token;
    switch (t->type) {
    case TOK_PLUS:
    case TOK_MINUS:
    case TOK_MULTIPLY:
    case TOK_DIVIDE:
    case TOK_MOD:
      info.order = BO_NATIVE;
      info.size  = expr_list_max_size (expr->cdr, hint, field_info);
      info.sgnd  = !expr_list_any_are_unsigned (expr->cdr, hint, field_info);
      break;

    case TOK_SHIFT_LEFT:
    case TOK_SHIFT_RIGHT:
      info = expr_info (expr->cdr, hint, field_info);  /* Get defaults. */
      info.order = BO_NATIVE;
      break;

    case TOK_BITWISE_AND:
    case TOK_BITWISE_OR:
    case TOK_BITWISE_XOR:
    case TOK_BITWISE_NOT:
      {
	List *l2;
	int big = 0, native = 0;
	info.sgnd = TRUE;
	for (l2 = expr->cdr; l2 != NULL; l2 = l2->cdr)
	  {
	    if (l2->token.type != TOK_NUMBER)
	      {
		ExprInfo info2 = expr_info (l2, hint, field_info);
		if (info2.order == BO_BIG_ENDIAN)
		  big++;
		else if (info2.order == BO_NATIVE)
		  native++;
		if (!info2.sgnd)
		  info.sgnd = FALSE;
	      }
	  }
	if (big == native)  /* Tie?  Then stick with the hint. */
	  info.order = hint;
	else info.order = (big > native) ? BO_BIG_ENDIAN : BO_NATIVE;
	info.size = expr_list_max_size (expr->cdr, hint, field_info);
      }
      break;

    case TOK_SWAP:
      info = expr_info (expr->cdr, hint, field_info);
      if (info.order == BO_BIG_ENDIAN)
	info.order = BO_NATIVE;
      else if (info.order == BO_NATIVE)
	info.order = BO_BIG_ENDIAN;
      info.size = t->u.swapinfo.size;
      info.sgnd = t->u.swapinfo.sgnd;
      break;

    case TOK_LIST:
      /* Stick with "unknown" default. */
      break;

    case TOK_ASSIGN:
#ifndef CCR_ELEMENT_8_BITS
      if (IS_CCBIT_TOKEN (expr->cdr->token.type))
	{
	  info = expr_info (CDDR (expr), hint, field_info);   /* rhs */
	}
      else
#endif
	{
	  info = expr_info (expr->cdr, hint, field_info);     /* lhs */
	}
      break;

    case TOK_CAST:
      info.order = BO_NATIVE;
      info.size  = BS_UNKNOWN;
      info.sgnd = FALSE;  /* Who knows? */
      break;

    case TOK_DEREF:
      if (t->u.derefinfo.size == 0)
	{
	  info.order = BO_NATIVE;
	  info.size  = BS_UNKNOWN;
	  info.sgnd  = FALSE;  /* Who knows? */
	}
      else
	{
	  info.order = BO_BIG_ENDIAN;
	  info.size  = t->u.derefinfo.size;
	  info.sgnd  = t->u.derefinfo.sgnd;
	}
      break;

    case TOK_EQUAL:
    case TOK_NOT_EQUAL:
    case TOK_GREATER_THAN:
    case TOK_LESS_THAN:
    case TOK_GREATER_OR_EQUAL:
    case TOK_LESS_OR_EQUAL:
    case TOK_AND:
    case TOK_OR:
    case TOK_XOR:
    case TOK_NOT:
      info.order = BO_NATIVE;
      info.size  = BS_BYTE;
      info.sgnd  = FALSE;
      break;

    case TOK_SWITCH:
    case TOK_IF:
      break;

    case TOK_DEFAULT:
      info.order = BO_NATIVE;   /* So it's a legal case number. */
      info.size  = BS_LONG;
      info.sgnd  = FALSE;
      break;

    case TOK_EXPLICIT_LIST:   /* Unknown everything. */
      break;

    case TOK_FUNC_CALL:
      info.order = BO_NATIVE;
      info.size  = BS_LONG;
      info.sgnd  = TRUE;  /* Who knows? */
      break;
      
    default:
      parse_error (expr, "byteorder.c: Don't know how to process "
		   "endianness/byte size for operator %s.\n",
		   unparse_token (t, buf));
      break;
    }
    break;

  default:
    parse_error (expr, "byteorder.c: Don't know how to process "
		 "endianness/byte size for %s.\n", unparse_token (t, buf));
    break;
  }

  return info;
}